

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

__int128 * __thiscall
calculator::ExpressionParser<__int128>::calculate
          (ExpressionParser<__int128> *this,__int128 v1,__int128 v2,Operator *op)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __int128 *p_Var5;
  __int128 *extraout_RAX;
  ulong extraout_RAX_00;
  ulong in_RCX;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong in_RSI;
  undefined4 *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  undefined1 in_stack_000000d0 [16];
  ExpressionParser<__int128> *in_stack_000000e8;
  byte local_68;
  __int128 *local_18;
  
  local_68 = (byte)in_RCX;
  switch(*in_R9) {
  case 1:
    local_18 = (__int128 *)(in_RSI | in_RCX);
    break;
  case 2:
    local_18 = (__int128 *)(in_RSI ^ in_RCX);
    break;
  case 3:
    local_18 = (__int128 *)(in_RSI & in_RCX);
    break;
  case 4:
    local_18 = (__int128 *)(in_RSI << (local_68 & 0x3f));
    if ((in_RCX & 0x40) != 0) {
      local_18 = (__int128 *)0x0;
    }
    break;
  case 5:
    local_18 = (__int128 *)(in_RSI >> (local_68 & 0x3f) | in_RDX << 0x40 - (local_68 & 0x3f));
    if ((in_RCX & 0x40) != 0) {
      local_18 = (__int128 *)(in_RDX >> (local_68 & 0x3f));
    }
    break;
  case 6:
    local_18 = (__int128 *)(in_RSI + in_RCX);
    break;
  case 7:
    local_18 = (__int128 *)(in_RSI - in_RCX);
    break;
  case 8:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = in_RCX;
    local_18 = SUB168(auVar1 * auVar3,0);
    break;
  case 9:
    p_Var5 = checkZero(in_stack_000000e8,(__int128)in_stack_000000d0);
    local_18 = (__int128 *)__divti3(in_RSI,in_RDX,p_Var5,extraout_RDX);
    break;
  case 10:
    p_Var5 = checkZero(in_stack_000000e8,(__int128)in_stack_000000d0);
    local_18 = (__int128 *)__modti3(in_RSI,in_RDX,p_Var5,extraout_RDX_00);
    break;
  case 0xb:
    pow(in_XMM0_Qa,in_XMM1_Qa);
    local_18 = extraout_RAX;
    break;
  case 0xc:
    pow(in_XMM0_Qa,in_XMM1_Qa);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = in_RSI;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = extraout_RAX_00;
    local_18 = SUB168(auVar2 * auVar4,0);
    break;
  default:
    local_18 = (__int128 *)0x0;
  }
  return local_18;
}

Assistant:

T calculate(T v1, T v2, const Operator& op) const
  {
    switch (op.op)
    {
      case OPERATOR_BITWISE_OR:     return v1 | v2;
      case OPERATOR_BITWISE_XOR:    return v1 ^ v2;
      case OPERATOR_BITWISE_AND:    return v1 & v2;
      case OPERATOR_BITWISE_SHL:    return v1 << v2;
      case OPERATOR_BITWISE_SHR:    return v1 >> v2;
      case OPERATOR_ADDITION:       return v1 + v2;
      case OPERATOR_SUBTRACTION:    return v1 - v2;
      case OPERATOR_MULTIPLICATION: return v1 * v2;
      case OPERATOR_DIVISION:       return v1 / checkZero(v2);
      case OPERATOR_MODULO:         return v1 % checkZero(v2);
      case OPERATOR_POWER:          return pow(v1, v2);
      case OPERATOR_EXPONENT:       return v1 * pow(10, v2);
      default:                      return 0;
    }
  }